

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat * __thiscall Mat::resize(Mat *__return_storage_ptr__,Mat *this,int a,int b)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  Mat *pMVar3;
  long lVar4;
  pointer p_Var5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  pointer p_Var9;
  int iVar10;
  vector<__int128,_std::allocator<__int128>_> temp;
  vector<__int128,_std::allocator<__int128>_> local_78;
  uint local_54;
  Mat *local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  local_54 = a;
  local_50 = __return_storage_ptr__;
  Mat(__return_storage_ptr__,a,b);
  local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_finish = (__int128 *)0x0;
  local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (__int128 *)0x0;
  if (0 < this->r) {
    iVar6 = 0;
    do {
      if (0 < this->c) {
        iVar10 = 0;
        do {
          lVar4 = (long)(this->r * iVar10 + iVar6);
          p_Var5 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_48 = (undefined8)p_Var5[lVar4];
          local_40 = *(undefined8 *)((long)p_Var5 + lVar4 * 0x10 + 8);
          if (local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<__int128,_std::allocator<__int128>_>::_M_realloc_insert<__int128>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                       super__Vector_impl_data._M_finish,(__int128 *)&local_48);
          }
          else {
            *(undefined8 *)
             local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_finish = local_48;
            *(undefined8 *)
             ((long)local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_finish + 8) = local_40;
            local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < this->c);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->r);
  }
  pMVar3 = local_50;
  if (0 < (int)local_54) {
    iVar6 = local_50->r;
    p_Var5 = (local_50->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    iVar10 = 0;
    do {
      if (0 < b) {
        lVar8 = (long)iVar10;
        iVar10 = iVar10 + b;
        lVar4 = 0;
        p_Var9 = p_Var5;
        do {
          puVar1 = (undefined8 *)
                   ((long)local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar4 + lVar8 * 0x10);
          uVar2 = puVar1[1];
          *(undefined8 *)p_Var9 = *puVar1;
          *(undefined8 *)((long)p_Var9 + 8) = uVar2;
          lVar4 = lVar4 + 0x10;
          p_Var9 = p_Var9 + iVar6;
        } while ((ulong)(uint)b << 4 != lVar4);
      }
      uVar7 = uVar7 + 1;
      p_Var5 = p_Var5 + 1;
    } while (uVar7 != local_54);
  }
  if (local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pMVar3;
}

Assistant:

Mat Mat::resize(int a, int b) {
    Mat ret(a, b);
    vector<ll128> temp;
    for (int i = 0; i < r; i++)
        for (int j = 0; j < c; j++)
            temp.push_back(get(i, j));
    int l = 0;
    for (int i = 0; i < a; i++)
        for (int j = 0; j < b; j++) {
            ret(i, j) = temp[l++];
        }
    return ret;
}